

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_string_pad(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int padEnd)

{
  bool bVar1;
  int iVar2;
  JSRefCountHeader *p_2;
  JSValueUnion p;
  JSValueUnion p_00;
  JSRefCountHeader *p_1;
  uint to;
  uint32_t to_00;
  uint count;
  uint uVar3;
  uint uVar4;
  JSValue JVar5;
  JSValue JVar6;
  StringBuffer b_s;
  uint local_64;
  JSValueUnion local_60;
  StringBuffer local_50;
  
  JVar5 = JS_ToStringCheckObject(ctx,this_val);
  p = JVar5.u;
  uVar4 = (uint)JVar5.tag;
  if (uVar4 == 6) {
    return (JSValue)(ZEXT816(6) << 0x40);
  }
  JVar6 = *argv;
  if (0xfffffff4 < (uint)argv->tag) {
    *(int *)(argv->u).ptr = *(argv->u).ptr + 1;
  }
  iVar2 = JS_ToInt32SatFree(ctx,(int *)&local_64,JVar6);
  if (iVar2 != 0) goto LAB_0016839c;
  to = *(uint *)((long)p.ptr + 4) & 0x7fffffff;
  count = local_64 - to;
  if (count == 0 || (int)local_64 < (int)to) {
    return JVar5;
  }
  uVar3 = 0x20;
  JVar6 = (JSValue)(ZEXT816(3) << 0x40);
  if (argc < 2) {
LAB_00168403:
    p_00.float64 = 0.0;
  }
  else {
    JVar6 = (JSValue)(ZEXT816(3) << 0x40);
    if ((int)argv[1].tag == 3) goto LAB_00168403;
    JVar6.tag = argv[1].tag;
    JVar6.u.ptr = argv[1].u.ptr;
    JVar6 = JS_ToStringInternal(ctx,JVar6,0);
    p_00 = JVar6.u;
    if ((uint)JVar6.tag == 6) goto LAB_0016839c;
    uVar3 = (uint)*(ulong *)((long)p_00.ptr + 4);
    if ((uVar3 & 0x7fffffff) == 1) {
      if ((int)uVar3 < 0) {
        uVar3 = (uint)(ushort)(((JSString *)((long)p_00.ptr + 0x10))->header).ref_count;
      }
      else {
        uVar3 = (uint)(byte)(((JSString *)((long)p_00.ptr + 0x10))->header).ref_count;
      }
      goto LAB_00168403;
    }
    if ((*(ulong *)((long)p_00.ptr + 4) & 0x7fffffff) == 0) {
      if ((uint)JVar6.tag < 0xfffffff5) {
        return JVar5;
      }
      iVar2 = *p_00.ptr;
      *(int *)p_00.ptr = iVar2 + -1;
      if (1 < iVar2) {
        return JVar5;
      }
      __JS_FreeValueRT(ctx->rt,JVar6);
      return JVar5;
    }
    uVar3 = 0x20;
  }
  if (0x3fffffff < local_64) {
    JS_ThrowInternalError(ctx,"string too long");
    goto LAB_0016839c;
  }
  local_50.size = local_64;
  local_50.len = 0;
  local_50.is_wide_char = 0;
  local_50.error_status = 0;
  _local_60 = JVar6;
  local_50.ctx = ctx;
  local_50.str = js_alloc_string(ctx,local_64,0);
  if (local_50.str != (JSString *)0x0) {
    if ((padEnd == 0) ||
       (iVar2 = string_buffer_concat(&local_50,(JSString *)p.ptr,0,to), iVar2 == 0)) {
      if ((JSString *)p_00.ptr == (JSString *)0x0) {
        iVar2 = string_buffer_fill(&local_50,uVar3,count);
        if (iVar2 != 0) goto LAB_001685d3;
      }
      else if (0 < (int)count) {
        do {
          to_00 = *(uint *)((long)p_00.ptr + 4) & 0x7fffffff;
          if (count < to_00) {
            to_00 = count;
          }
          iVar2 = string_buffer_concat(&local_50,(JSString *)p_00.ptr,0,to_00);
          if (iVar2 != 0) goto LAB_001685d3;
          uVar3 = count - to_00;
          bVar1 = (int)to_00 <= (int)count;
          count = uVar3;
        } while (uVar3 != 0 && bVar1);
      }
      if ((padEnd != 0) ||
         (iVar2 = string_buffer_concat(&local_50,(JSString *)p.ptr,0,to), iVar2 == 0)) {
        if ((0xfffffff4 < local_60._8_4_) &&
           (iVar2 = *local_60.ptr, *(int *)local_60.ptr = iVar2 + -1, iVar2 < 2)) {
          __JS_FreeValueRT(ctx->rt,_local_60);
        }
        if ((0xfffffff4 < uVar4) && (iVar2 = *p.ptr, *(int *)p.ptr = iVar2 + -1, iVar2 < 2)) {
          __JS_FreeValueRT(ctx->rt,JVar5);
        }
        JVar5 = string_buffer_end(&local_50);
        return JVar5;
      }
    }
LAB_001685d3:
    js_string_pad_cold_1();
  }
  js_string_pad_cold_2();
LAB_0016839c:
  if ((0xfffffff4 < uVar4) && (iVar2 = *p.ptr, *(int *)p.ptr = iVar2 + -1, iVar2 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar5);
  }
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_string_pad(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv, int padEnd)
{
    JSValue str, v = JS_UNDEFINED;
    StringBuffer b_s, *b = &b_s;
    JSString *p, *p1 = NULL;
    int n, len, c = ' ';

    str = JS_ToStringCheckObject(ctx, this_val);
    if (JS_IsException(str))
        goto fail1;
    if (JS_ToInt32Sat(ctx, &n, argv[0]))
        goto fail2;
    p = JS_VALUE_GET_STRING(str);
    len = p->len;
    if (len >= n)
        return str;
    if (argc > 1 && !JS_IsUndefined(argv[1])) {
        v = JS_ToString(ctx, argv[1]);
        if (JS_IsException(v))
            goto fail2;
        p1 = JS_VALUE_GET_STRING(v);
        if (p1->len == 0) {
            JS_FreeValue(ctx, v);
            return str;
        }
        if (p1->len == 1) {
            c = string_get(p1, 0);
            p1 = NULL;
        }
    }
    if (n > JS_STRING_LEN_MAX) {
        JS_ThrowInternalError(ctx, "string too long");
        goto fail2;
    }
    if (string_buffer_init(ctx, b, n))
        goto fail3;
    n -= len;
    if (padEnd) {
        if (string_buffer_concat(b, p, 0, len))
            goto fail;
    }
    if (p1) {
        while (n > 0) {
            int chunk = min_int(n, p1->len);
            if (string_buffer_concat(b, p1, 0, chunk))
                goto fail;
            n -= chunk;
        }
    } else {
        if (string_buffer_fill(b, c, n))
            goto fail;
    }
    if (!padEnd) {
        if (string_buffer_concat(b, p, 0, len))
            goto fail;
    }
    JS_FreeValue(ctx, v);
    JS_FreeValue(ctx, str);
    return string_buffer_end(b);

fail:
    string_buffer_free(b);
fail3:
    JS_FreeValue(ctx, v);
fail2:
    JS_FreeValue(ctx, str);
fail1:
    return JS_EXCEPTION;
}